

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f wi)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar18;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Float FVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 extraout_var [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Point3f PVar52;
  Ray ray;
  optional<pbrt::ShapeIntersection> isect;
  Tuple3<pbrt::Vector3,_float> local_1c8;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  Ray local_150;
  undefined1 local_128 [256];
  bool local_28;
  undefined1 extraout_var_00 [56];
  undefined1 auVar31 [56];
  
  local_1c8.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._8_56_ = wi._8_56_;
  auVar28._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1c8._0_8_ = vmovlps_avx(auVar28._0_16_);
  auVar19._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar19._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar19._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar19._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar25._0_4_ = (float)uVar2 + auVar19._0_4_;
  auVar25._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar19._4_4_;
  auVar25._8_4_ = auVar19._8_4_ + 0.0;
  auVar25._12_4_ = auVar19._12_4_ + 0.0;
  auVar21._8_4_ = 0x3f000000;
  auVar21._0_8_ = 0x3f0000003f000000;
  auVar21._12_4_ = 0x3f000000;
  auVar19 = vmulps_avx512vl(auVar25,auVar21);
  uVar2 = vmovlps_avx(auVar19);
  local_128._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  local_128._0_8_ = uVar2;
  FVar23 = SolidAngle(this,(Point3f *)local_128);
  if ((FVar23 < 0.0002) || (6.22 < FVar23)) {
    auVar31 = extraout_var;
    PVar52 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_1c8);
    local_150.o.super_Tuple3<pbrt::Point3,_float>.z = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
    auVar30._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar30._8_56_ = auVar31;
    local_150.time = ctx->time;
    local_150.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar30._0_16_);
    local_150.d.super_Tuple3<pbrt::Vector3,_float>.x = local_1c8.x;
    local_150.d.super_Tuple3<pbrt::Vector3,_float>.y = local_1c8.y;
    local_150.d.super_Tuple3<pbrt::Vector3,_float>.z = local_1c8.z;
    local_150.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    Intersect((optional<pbrt::ShapeIntersection> *)local_128,this,&local_150,INFINITY);
    local_1b8 = 0.0;
    if (local_28 == true) {
      FVar23 = Area(this);
      if (local_28 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
      }
      uVar42 = local_128._8_4_;
      auVar19 = local_128._4_16_;
      auVar36 = local_128._0_16_;
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_128._20_4_),0x10);
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(ZEXT416((uint)local_1c8.z),auVar22);
      auVar21 = ZEXT416((uint)((float)local_128._48_4_ * auVar21._0_4_));
      auVar25 = vfnmadd132ss_fma(ZEXT416((uint)local_128._44_4_),auVar21,ZEXT416((uint)local_1c8.y))
      ;
      auVar22 = vfnmsub213ss_fma(ZEXT416((uint)local_1c8.z),ZEXT416((uint)local_128._48_4_),auVar21)
      ;
      auVar8._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar8._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar8._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar8._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar21 = vinsertps_avx(auVar8,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
                              ,0x10);
      auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar22._0_4_)),
                                ZEXT416((uint)local_128._40_4_),ZEXT416((uint)local_1c8.x));
      auVar25 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl(auVar8,auVar20);
      fVar1 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low + (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
              ((float)uVar42 + (float)local_128._12_4_) * 0.5;
      auVar8 = vinsertps_avx(auVar36,ZEXT416((uint)local_128._16_4_),0x10);
      auVar36._0_4_ = (auVar21._0_4_ + auVar25._0_4_) * 0.5;
      auVar36._4_4_ = (auVar21._4_4_ + auVar25._4_4_) * 0.5;
      auVar36._8_4_ = (auVar21._8_4_ + auVar25._8_4_) * 0.5;
      auVar36._12_4_ = (auVar21._12_4_ + auVar25._12_4_) * 0.5;
      auVar41._0_4_ = (auVar8._0_4_ + auVar19._0_4_) * 0.5;
      auVar41._4_4_ = (auVar8._4_4_ + auVar19._4_4_) * 0.5;
      auVar41._8_4_ = (auVar8._8_4_ + auVar19._8_4_) * 0.5;
      auVar41._12_4_ = (auVar8._12_4_ + auVar19._12_4_) * 0.5;
      auVar19 = vsubps_avx(auVar36,auVar41);
      auVar37._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar37._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar37._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar37._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar19 = vmovshdup_avx(auVar37);
      local_1b8 = (1.0 / FVar23) / (auVar22._0_4_ / (auVar37._0_4_ + fVar1 * fVar1 + auVar19._0_4_))
      ;
      local_1b8 = (float)((uint)(ABS(local_1b8) != INFINITY) * (int)local_1b8);
    }
  }
  else {
    local_1b8 = 1.0 / FVar23;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
        (fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar1 != 0.0)) || (NAN(fVar1))) {
      lVar14 = (long)this->triIndex;
      uStack_1b4 = 0;
      uStack_1b0 = 0;
      uStack_1ac = 0;
      lVar7 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar13 = *(long *)(lVar7 + 8);
      lVar7 = *(long *)(lVar7 + 0x10);
      lVar15 = (long)*(int *)(lVar13 + lVar14 * 0xc);
      lVar16 = (long)*(int *)(lVar13 + 4 + lVar14 * 0xc);
      lVar13 = (long)*(int *)(lVar13 + 8 + lVar14 * 0xc);
      local_188._8_8_ = 0;
      local_188._0_8_ = *(ulong *)(lVar7 + 4 + lVar15 * 0xc);
      uVar3 = *(ulong *)(lVar7 + 4 + lVar16 * 0xc);
      local_198._8_8_ = 0;
      local_198._0_8_ = uVar3;
      uVar4 = *(ulong *)(lVar7 + lVar13 * 0xc);
      local_1a8._8_8_ = 0;
      local_1a8._0_8_ = uVar4;
      local_1bc = *(float *)(lVar7 + 8 + lVar13 * 0xc);
      local_168 = ZEXT416(*(uint *)(lVar7 + lVar15 * 0xc));
      auVar19 = vpermi2ps_avx512vl(_DAT_00447ce0,local_188,local_168);
      local_178 = ZEXT416(*(uint *)(lVar7 + lVar16 * 0xc));
      auVar19 = vinsertps_avx(auVar19,local_178,0x30);
      auVar35._16_8_ = uVar3;
      auVar35._0_16_ = auVar19;
      auVar35._24_8_ = 0;
      auVar27._16_8_ = uVar4;
      auVar27._0_16_ = auVar19;
      auVar27._24_8_ = 0;
      local_128._0_32_ = vshufpd_avx(auVar35,auVar27,2);
      auVar5._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar5._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar5._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar5._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar2 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auVar19 = vinsertps_avx(auVar5,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar26._0_4_ = (float)uVar2 + auVar19._0_4_;
      auVar26._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar19._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + 0.0;
      auVar26._12_4_ = auVar19._12_4_ + 0.0;
      auVar9._8_4_ = 0x3f000000;
      auVar9._0_8_ = 0x3f0000003f000000;
      auVar9._12_4_ = 0x3f000000;
      auVar19 = vmulps_avx512vl(auVar26,auVar9);
      local_150.o.super_Tuple3<pbrt::Point3,_float>.z =
           ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * 0.5;
      local_150.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar19);
      local_128._32_4_ = local_1bc;
      auVar29._0_8_ =
           InvertSphericalTriangleSample
                     ((array<pbrt::Point3<float>,_3> *)local_128,&local_150.o,(Vector3f *)&local_1c8
                     );
      auVar29._8_56_ = extraout_var_00;
      auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar6._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar2 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      fVar49 = 0.0;
      auVar19 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar21 = vinsertps_avx(local_168,ZEXT416((uint)local_178._0_4_),0x10);
      fVar24 = auVar29._0_4_;
      fVar17 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar33._0_4_ = (float)uVar2 + auVar19._0_4_;
      auVar33._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar19._4_4_;
      auVar33._8_4_ = auVar19._8_4_ + 0.0;
      auVar33._12_4_ = auVar19._12_4_ + 0.0;
      auVar10._8_4_ = 0x3f000000;
      auVar10._0_8_ = 0x3f0000003f000000;
      auVar10._12_4_ = 0x3f000000;
      auVar20 = vmulps_avx512vl(auVar33,auVar10);
      auVar19 = vinsertps_avx(local_198,local_188,0x4c);
      auVar38._4_4_ = fVar17;
      auVar38._0_4_ = fVar17;
      auVar38._8_4_ = fVar17;
      auVar38._12_4_ = fVar17;
      auVar8 = vsubps_avx(auVar19,auVar38);
      uVar42 = auVar20._0_4_;
      auVar44._4_4_ = uVar42;
      auVar44._0_4_ = uVar42;
      auVar44._8_4_ = uVar42;
      auVar44._12_4_ = uVar42;
      auVar22 = vsubps_avx(auVar21,auVar44);
      auVar19 = vinsertps_avx(local_188,local_198,0x1c);
      auVar21 = vmovshdup_avx(auVar20);
      auVar21 = vsubps_avx(auVar19,auVar21);
      auVar39._0_4_ =
           auVar21._0_4_ * auVar21._0_4_ + auVar22._0_4_ * auVar22._0_4_ +
           auVar8._0_4_ * auVar8._0_4_;
      auVar39._4_4_ =
           auVar21._4_4_ * auVar21._4_4_ + auVar22._4_4_ * auVar22._4_4_ +
           auVar8._4_4_ * auVar8._4_4_;
      auVar39._8_4_ =
           auVar21._8_4_ * auVar21._8_4_ + auVar22._8_4_ * auVar22._8_4_ +
           auVar8._8_4_ * auVar8._8_4_;
      auVar39._12_4_ =
           auVar21._12_4_ * auVar21._12_4_ + auVar22._12_4_ * auVar22._12_4_ +
           auVar8._12_4_ * auVar8._12_4_;
      auVar25 = vsqrtps_avx(auVar39);
      fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar40._4_4_ = fVar1;
      auVar40._0_4_ = fVar1;
      auVar40._8_4_ = fVar1;
      auVar40._12_4_ = fVar1;
      auVar19 = vdivps_avx(auVar8,auVar25);
      auVar21 = vdivps_avx(auVar21,auVar25);
      auVar25 = vdivps_avx(auVar22,auVar25);
      fVar32 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      auVar43._4_4_ = fVar32;
      auVar43._0_4_ = fVar32;
      auVar43._8_4_ = fVar32;
      auVar43._12_4_ = fVar32;
      auVar46._0_4_ = fVar1 * auVar19._0_4_;
      auVar46._4_4_ = fVar1 * auVar19._4_4_;
      auVar46._8_4_ = fVar1 * auVar19._8_4_;
      auVar46._12_4_ = fVar1 * auVar19._12_4_;
      auVar21 = vfmadd213ps_fma(auVar21,auVar43,auVar46);
      auVar19 = vfmsub213ps_fma(auVar19,auVar40,auVar46);
      auVar34._0_4_ = auVar21._0_4_ + auVar19._0_4_;
      auVar34._4_4_ = auVar21._4_4_ + auVar19._4_4_;
      auVar34._8_4_ = auVar21._8_4_ + auVar19._8_4_;
      auVar34._12_4_ = auVar21._12_4_ + auVar19._12_4_;
      fVar32 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      auVar45._4_4_ = fVar32;
      auVar45._0_4_ = fVar32;
      auVar45._8_4_ = fVar32;
      auVar45._12_4_ = fVar32;
      auVar19 = vfmadd231ps_fma(auVar34,auVar45,auVar25);
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx(auVar47,auVar19);
      auVar11._8_4_ = 0x3c23d70a;
      auVar11._0_8_ = 0x3c23d70a3c23d70a;
      auVar11._12_4_ = 0x3c23d70a;
      uVar3 = vcmpps_avx512vl(auVar19,auVar11,0xe);
      if ((0.0 <= fVar24) && (fVar24 <= 1.0)) {
        auVar21 = vmovshdup_avx(auVar29._0_16_);
        fVar32 = auVar21._0_4_;
        if ((0.0 <= fVar32) && (fVar32 <= 1.0)) {
          bVar12 = (byte)(uVar3 >> 1);
          auVar25 = vshufps_avx(auVar19,auVar19,0xf5);
          local_1bc = local_1bc - fVar17;
          auVar8 = vsubps_avx(local_1a8,auVar20);
          fVar17 = auVar8._0_4_;
          auVar48._0_4_ = fVar17 * fVar17;
          auVar48._4_4_ = auVar8._4_4_ * auVar8._4_4_;
          auVar48._8_4_ = auVar8._8_4_ * auVar8._8_4_;
          auVar48._12_4_ = auVar8._12_4_ * auVar8._12_4_;
          auVar21 = vhaddps_avx(auVar48,auVar48);
          auVar21 = ZEXT416((uint)(auVar21._0_4_ + local_1bc * local_1bc));
          auVar21 = vsqrtss_avx(auVar21,auVar21);
          fVar49 = auVar21._0_4_;
          auVar50._0_4_ = fVar17 / fVar49;
          auVar50._4_12_ = auVar8._4_12_;
          auVar21 = vmovshdup_avx(auVar8);
          auVar51._0_4_ = auVar21._0_4_ / fVar49;
          auVar51._4_12_ = auVar21._4_12_;
          fVar17 = (float)((uint)(bVar12 & 1) * auVar25._0_4_ +
                          (uint)!(bool)(bVar12 & 1) * 0x3c23d70a);
          auVar25 = ZEXT416((uint)((local_1bc / fVar49) * fVar1));
          auVar21 = vfmadd213ss_fma(auVar51,auVar43,auVar25);
          auVar25 = vfmsub213ss_fma(ZEXT416((uint)(local_1bc / fVar49)),auVar40,auVar25);
          auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar25._0_4_)),auVar45,auVar50);
          fVar49 = 1.0;
          auVar21 = vandps_avx(auVar47,auVar21);
          auVar21 = vmaxss_avx(auVar21,SUB6416(ZEXT464(0x3c23d70a),0));
          fVar18 = (float)((uint)((byte)uVar3 & 1) * auVar19._0_4_ +
                          (uint)!(bool)((byte)uVar3 & 1) * 0x3c23d70a);
          fVar1 = fVar17 + fVar17 + fVar18 + auVar21._0_4_;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (1.0 - fVar32) * fVar17)),
                                      ZEXT416((uint)fVar17),
                                      ZEXT416((uint)((1.0 - fVar24) * (1.0 - fVar32))));
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)(fVar32 * (1.0 - fVar24)))
                                      ,auVar19);
            auVar19 = vfmadd213ss_fma(auVar21,ZEXT416((uint)(fVar24 * fVar32)),auVar19);
            fVar49 = (auVar19._0_4_ * 4.0) / fVar1;
          }
        }
      }
      local_1b8 = local_1b8 * fVar49;
    }
  }
  return local_1b8;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }